

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_effectiveness.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  byte bVar4;
  string *file_name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type sVar6;
  string *psVar7;
  pointer this;
  path *this_00;
  string short_name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> input_u32s;
  string file_name;
  smatch what;
  directory_iterator i;
  directory_iterator end_itr;
  path p;
  regex input_file_filter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_dir;
  variables_map cmdargs;
  string *in_stack_fffffffffffff9c8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffff9d0;
  key_type *in_stack_fffffffffffff9d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffff9e0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffff9e8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffff9f0;
  undefined6 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa06;
  undefined1 in_stack_fffffffffffffa07;
  char *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa28;
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string *in_stack_fffffffffffffb18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb20;
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [8];
  char **in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbac;
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  path local_388;
  string local_368 [32];
  string local_348 [56];
  string local_310 [63];
  undefined1 local_2d1 [57];
  string local_298 [32];
  path local_278 [4];
  undefined4 local_1f4;
  path local_1c0;
  path local_1a0 [3];
  allocator<char> local_139;
  string local_138 [71];
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [48];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a0 [156];
  int local_4;
  
  local_4 = 0;
  parse_cmdargs(in_stack_fffffffffffffbac,in_stack_fffffffffffffba0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffa07,
                      CONCAT16(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00)));
  file_name_00 = (string *)
                 boost::program_options::variables_map::operator[]
                           ((variables_map *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  pbVar5 = boost::program_options::variable_value::as<std::__cxx11::string>
                     ((variable_value *)0x1872ec);
  std::__cxx11::string::string(local_d0,(string *)pbVar5);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
             (flag_type)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffa07,
                      CONCAT16(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00)));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  if (sVar6 != 0) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                in_stack_fffffffffffff9f0,(char *)in_stack_fffffffffffff9e8,
                (flag_type)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::operator=
              ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
               in_stack_fffffffffffff9d0,
               (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
               in_stack_fffffffffffff9c8);
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    ~basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                 0x187409);
  }
  boost::filesystem::path::path((path *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  bVar1 = boost::filesystem::is_regular_file((path *)in_stack_fffffffffffff9d0);
  if (bVar1) {
    boost::filesystem::path::filename();
    boost::filesystem::path::string_abi_cxx11_(local_1a0);
    boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
               in_stack_fffffffffffff9f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9e8,(flag_type)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::operator=
              ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
               in_stack_fffffffffffff9d0,
               (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
               in_stack_fffffffffffff9c8);
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    ~basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                 0x187594);
    boost::filesystem::path::~path((path *)0x1875a1);
    boost::filesystem::path::parent_path();
    psVar7 = boost::filesystem::path::string_abi_cxx11_(&local_1c0);
    std::__cxx11::string::operator=(local_d0,(string *)psVar7);
    boost::filesystem::path::~path((path *)0x1875ed);
  }
  boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)0x187687);
  boost::filesystem::path::path((path *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  boost::filesystem::directory_iterator::directory_iterator
            ((directory_iterator *)in_stack_fffffffffffff9f0,(path *)in_stack_fffffffffffff9e8,
             (directory_options)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
  boost::filesystem::path::~path((path *)0x1876c4);
  while (uVar2 = boost::iterators::operator!=
                           ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)in_stack_fffffffffffff9e0,
                            (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)in_stack_fffffffffffff9d8), (bool)uVar2) {
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                  *)0x18776b);
    boost::filesystem::directory_entry::status((directory_entry *)in_stack_fffffffffffff9c8);
    bVar1 = boost::filesystem::is_regular_file((file_status *)0x187793);
    if (bVar1) {
      std::
      allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::allocator((allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x1877ae);
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results(in_stack_fffffffffffff9f0,
                      (allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff9e8);
      std::
      allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~allocator((allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x1877cf);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               boost::iterators::detail::
               iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                             *)0x1877dc);
      boost::filesystem::directory_entry::path((directory_entry *)pbVar5);
      boost::filesystem::path::filename();
      psVar7 = boost::filesystem::path::string_abi_cxx11_(local_278);
      uVar3 = boost::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                         (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)in_stack_fffffffffffff9e0,
                         (match_flag_type)((ulong)in_stack_fffffffffffff9d8 >> 0x20));
      bVar4 = uVar3 ^ 0xff;
      boost::filesystem::path::~path((path *)0x18784c);
      if ((bVar4 & 1) == 0) {
        this = boost::iterators::detail::
               iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                             *)0x1878d8);
        this_00 = boost::filesystem::directory_entry::path(this);
        in_stack_fffffffffffff9f0 =
             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)boost::filesystem::path::string_abi_cxx11_(this_00);
        std::__cxx11::string::string(local_298,(string *)in_stack_fffffffffffff9f0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x187919);
        in_stack_fffffffffffff9e0 = local_a0;
        in_stack_fffffffffffff9e8 =
             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_2d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (pbVar5,(char *)psVar7,
                   (allocator<char> *)CONCAT17(uVar3,CONCAT16(bVar4,in_stack_fffffffffffffa00)));
        in_stack_fffffffffffff9d8 =
             (key_type *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        std::__cxx11::string::~string((string *)(local_2d1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_2d1);
        if (in_stack_fffffffffffff9d8 == (key_type *)0x0) {
          std::__cxx11::string::string(local_348,local_298);
          read_file_u32(file_name_00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff9e0,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff9d8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff9e0);
          std::__cxx11::string::~string(local_348);
        }
        else {
          std::__cxx11::string::string(local_310,local_298);
          read_file_text((string *)CONCAT17(uVar2,in_stack_fffffffffffffa28));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff9e0,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff9d8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff9e0);
          std::__cxx11::string::~string(local_310);
        }
        in_stack_fffffffffffff9d0 =
             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)boost::iterators::detail::
                iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                              *)0x187b11);
        boost::filesystem::directory_entry::path((directory_entry *)in_stack_fffffffffffff9d0);
        boost::filesystem::path::stem();
        in_stack_fffffffffffff9c8 = boost::filesystem::path::string_abi_cxx11_(&local_388);
        std::__cxx11::string::string(local_368,(string *)in_stack_fffffffffffff9c8);
        boost::filesystem::path::~path((path *)0x187b67);
        std::__cxx11::string::string(local_3a8,local_368);
        run<ANSfold<1u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_3a8);
        std::__cxx11::string::string(local_3c8,local_368);
        run<ANSfold<2u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::string(local_3e8,local_368);
        run<ANSfold<3u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::string::string(local_408,local_368);
        run<ANSfold<4u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_408);
        std::__cxx11::string::string(local_428,local_368);
        run<ANSfold<5u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::string(local_448,local_368);
        run<ANSfold<6u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_448);
        std::__cxx11::string::string(local_468,local_368);
        run<ANSfold<7u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_468);
        std::__cxx11::string::string(local_488,local_368);
        run<ANSfold<8u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_488);
        std::__cxx11::string::string(local_4a8,local_368);
        run<ANSrfold<1u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_4a8);
        std::__cxx11::string::string(local_4c8,local_368);
        run<ANSrfold<2u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_4c8);
        std::__cxx11::string::string((string *)&stack0xfffffffffffffb18,local_368);
        run<ANSrfold<3u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb18);
        std::__cxx11::string::string(local_508,local_368);
        run<ANSrfold<4u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_508);
        std::__cxx11::string::string(local_528,local_368);
        run<ANSrfold<5u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::string(local_548,local_368);
        run<ANSrfold<6u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_548);
        std::__cxx11::string::string(local_568,local_368);
        run<ANSrfold<7u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_568);
        std::__cxx11::string::string(local_588,local_368);
        run<ANSrfold<8u>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_588);
        std::__cxx11::string::~string(local_368);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9e0)
        ;
        std::__cxx11::string::~string(local_298);
        local_1f4 = 0;
      }
      else {
        local_1f4 = 4;
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results(in_stack_fffffffffffff9d0);
    }
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                  *)in_stack_fffffffffffff9d0);
  }
  local_1f4 = 2;
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x187701);
  local_4 = 0;
  local_1f4 = 1;
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x188272);
  boost::filesystem::path::~path((path *)0x18827f);
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::~basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             0x18828c);
  std::__cxx11::string::~string(local_d0);
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_fffffffffffff9d0);
  return local_4;
}

Assistant:

int main(int argc, char const* argv[])
{
    auto cmdargs = parse_cmdargs(argc, argv);
    auto input_dir = cmdargs["input"].as<std::string>();

    boost::regex input_file_filter(".*\\.u32");
    if (cmdargs.count("text")) {
        input_file_filter = boost::regex(".*\\.txt");
    }

    // single file also works!
    boost::filesystem::path p(input_dir);
    if (boost::filesystem::is_regular_file(p)) {
        input_file_filter = boost::regex(p.filename().string());
        input_dir = p.parent_path().string();
    }

    boost::filesystem::directory_iterator
        end_itr; // Default ctor yields past-the-end
    for (boost::filesystem::directory_iterator i(input_dir); i != end_itr;
         ++i) {
        if (!boost::filesystem::is_regular_file(i->status()))
            continue;
        boost::smatch what;
        if (!boost::regex_match(
                i->path().filename().string(), what, input_file_filter))
            continue;

        std::string file_name = i->path().string();
        std::vector<uint32_t> input_u32s;
        if (cmdargs.count("text")) {
            input_u32s = read_file_text(file_name);
        } else {
            input_u32s = read_file_u32(file_name);
        }
        std::string short_name = i->path().stem().string();

        run<ANSfold<1>>(input_u32s, short_name);
        run<ANSfold<2>>(input_u32s, short_name);
        run<ANSfold<3>>(input_u32s, short_name);
        run<ANSfold<4>>(input_u32s, short_name);
        run<ANSfold<5>>(input_u32s, short_name);
        run<ANSfold<6>>(input_u32s, short_name);
        run<ANSfold<7>>(input_u32s, short_name);
        run<ANSfold<8>>(input_u32s, short_name);

        run<ANSrfold<1>>(input_u32s, short_name);
        run<ANSrfold<2>>(input_u32s, short_name);
        run<ANSrfold<3>>(input_u32s, short_name);
        run<ANSrfold<4>>(input_u32s, short_name);
        run<ANSrfold<5>>(input_u32s, short_name);
        run<ANSrfold<6>>(input_u32s, short_name);
        run<ANSrfold<7>>(input_u32s, short_name);
        run<ANSrfold<8>>(input_u32s, short_name);
    }

    return EXIT_SUCCESS;
}